

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

void __thiscall r_exec::MkHighAct::MkHighAct(MkHighAct *this,Mem *m,Code *object)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Atom local_3c [4];
  Atom local_38 [16];
  Atom local_28 [6];
  short local_22;
  Code *pCStack_20;
  uint16_t write_index;
  Code *object_local;
  Mem *m_local;
  MkHighAct *this_local;
  
  pCStack_20 = object;
  object_local = (Code *)m;
  m_local = (Mem *)this;
  LObject::LObject(&this->super_LObject,m);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__MkHighAct_002eaa28;
  local_22 = 0;
  r_code::Atom::Marker((ushort)local_28,(uchar)Opcodes::MkHighAct);
  local_22 = local_22 + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_28);
  r_code::Atom::~Atom(local_28);
  r_code::Atom::RPointer((ushort)local_38);
  local_22 = local_22 + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_38);
  r_code::Atom::~Atom(local_38);
  r_code::Atom::Float(0.0);
  local_22 = local_22 + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[8])(this,0,pCStack_20);
  return;
}

Assistant:

MkHighAct::MkHighAct(r_code::Mem *m, Code *object): LObject(m)
{
    uint16_t write_index = 0;
    code(write_index++) = r_code::Atom::Marker(Opcodes::MkHighAct, 2);
    code(write_index++) = r_code::Atom::RPointer(0); // object.
    code(write_index++) = r_code::Atom::Float(0); // psln_thr.
    set_reference(0, object);
}